

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O1

TValue * cpluaopen(lua_State *L,lua_CFunction dummy,void *ud)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  GCtab *pGVar4;
  GCstr *pGVar5;
  size_t lenx;
  undefined8 *puVar6;
  uint8_t uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  size_t lenx_00;
  long lVar11;
  
  uVar3 = (ulong)(L->glref).ptr32;
  stack_init(L,L);
  uVar8 = 0;
  pGVar4 = lj_tab_new(L,0,6);
  (L->env).gcptr32 = (uint32_t)pGVar4;
  uVar9 = (ulong)(L->glref).ptr32;
  pGVar4 = lj_tab_new(L,0,2);
  *(int *)(uVar9 + 0x98) = (int)pGVar4;
  *(undefined4 *)(uVar9 + 0x9c) = 0xfffffff4;
  lj_str_resize(L,0xff);
  uVar2 = (L->glref).ptr32;
  pcVar10 = 
  "__index__newindex__gc__mode__eq__len__lt__le__concat__call__add__sub__mul__div__mod__pow__unm__metatable__tostring__new__pairs__ipairs"
  ;
  do {
    for (lenx_00 = 2; (cVar1 = pcVar10[lenx_00], cVar1 != '\0' && (cVar1 != '_'));
        lenx_00 = lenx_00 + 1) {
    }
    pGVar5 = lj_str_new(L,pcVar10,lenx_00);
    *(int *)((ulong)uVar2 + 0x100 + uVar8 * 4) = (int)pGVar5;
    uVar8 = (ulong)((int)uVar8 + 1);
    pcVar10 = pcVar10 + lenx_00;
  } while (cVar1 != '\0');
  uVar7 = '\x01';
  lVar11 = 0;
  do {
    pcVar10 = *(char **)((long)tokennames + lVar11);
    lenx = strlen(pcVar10);
    pGVar5 = lj_str_new(L,pcVar10,lenx);
    pGVar5->marked = pGVar5->marked | 0x20;
    pGVar5->reserved = uVar7;
    lVar11 = lVar11 + 8;
    uVar7 = uVar7 + '\x01';
  } while (lVar11 != 0xb0);
  pGVar5 = lj_err_str(L,LJ_ERR_ERRMEM);
  pGVar5->marked = pGVar5->marked | 0x20;
  *(int *)(uVar3 + 0x24) = *(int *)(uVar3 + 0x20) << 2;
  puVar6 = (undefined8 *)(uVar3 + 0x27f & 0xfffffffffffffff0);
  *puVar6 = 0x7fffffffffffffff;
  puVar6[1] = 0x7fffffffffffffff;
  puVar6 = (undefined8 *)(uVar3 + 0x28f & 0xfffffffffffffff0);
  *puVar6 = 0x8000000000000000;
  puVar6[1] = 0x8000000000000000;
  return (TValue *)0x0;
}

Assistant:

static TValue *cpluaopen(lua_State *L, lua_CFunction dummy, void *ud)
{
  global_State *g = G(L);
  UNUSED(dummy);
  UNUSED(ud);
  stack_init(L, L);
  /* NOBARRIER: State initialization, all objects are white. */
  setgcref(L->env, obj2gco(lj_tab_new(L, 0, LJ_MIN_GLOBAL)));
  settabV(L, registry(L), lj_tab_new(L, 0, LJ_MIN_REGISTRY));
  lj_str_resize(L, LJ_MIN_STRTAB-1);
  lj_meta_init(L);
  lj_lex_init(L);
  fixstring(lj_err_str(L, LJ_ERR_ERRMEM));  /* Preallocate memory error msg. */
  g->gc.threshold = 4*g->gc.total;
  lj_trace_initstate(g);
  return NULL;
}